

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void set_closure_from_var(JSContext *ctx,JSClosureVar *cv,JSVarDef *vd,int var_idx)

{
  JSAtom JVar1;
  JSAtomStruct *pJVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  
  bVar3 = (*(byte *)cv & 0xfc) + 1;
  *(byte *)cv = bVar3;
  bVar4 = (vd->field_0xc & 1) << 2;
  *(byte *)cv = bVar3 & 0xf9 | bVar4;
  bVar5 = (vd->field_0xc & 2) << 2;
  *(byte *)cv = bVar3 & 0xf1 | bVar4 | bVar5;
  *(byte *)cv = bVar3 & 1 | bVar4 | bVar5 | vd->field_0xc * '\x02' & 0xf0U;
  cv->var_idx = (uint16_t)var_idx;
  JVar1 = vd->var_name;
  if (0xd1 < (long)(int)JVar1) {
    pJVar2 = ctx->rt->atom_array[(int)JVar1];
    (pJVar2->header).ref_count = (pJVar2->header).ref_count + 1;
  }
  cv->var_name = JVar1;
  return;
}

Assistant:

static void set_closure_from_var(JSContext *ctx, JSClosureVar *cv,
                                 JSVarDef *vd, int var_idx)
{
    cv->is_local = TRUE;
    cv->is_arg = FALSE;
    cv->is_const = vd->is_const;
    cv->is_lexical = vd->is_lexical;
    cv->var_kind = vd->var_kind;
    cv->var_idx = var_idx;
    cv->var_name = JS_DupAtom(ctx, vd->var_name);
}